

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

int ValidateAsciiCharactersFilter(char *mapKey,char *mapValue)

{
  _Bool _Var1;
  int local_1c;
  int result;
  char *mapValue_local;
  char *mapKey_local;
  
  _Var1 = ContainsValidUsAscii(mapKey);
  if ((_Var1) && (_Var1 = ContainsValidUsAscii(mapValue), _Var1)) {
    local_1c = 0;
  }
  else {
    local_1c = 0x43;
  }
  return local_1c;
}

Assistant:

static int ValidateAsciiCharactersFilter(const char* mapKey, const char* mapValue)
{
    int result;
    if (!ContainsValidUsAscii(mapKey) || !ContainsValidUsAscii(mapValue))
    {
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }
    return result;
}